

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * s2b(char *s,int nd0,int nd,uint32 y9)

{
  int local_40;
  int32 y;
  int32 x;
  int k;
  int i;
  Bigint *b;
  uint32 y9_local;
  int nd_local;
  int nd0_local;
  char *s_local;
  
  y = 0;
  for (local_40 = 1; local_40 < (nd + 8) / 9; local_40 = local_40 << 1) {
    y = y + 1;
  }
  _k = Balloc(y);
  if (_k == (Bigint *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    _k->x[0] = y9;
    _k->wds = 1;
    s_local = (char *)_k;
    if (9 < nd) {
      _nd_local = s + 9;
      for (x = 9; x < nd0; x = x + 1) {
        _k = multadd(_k,10,*_nd_local + -0x30);
        if (_k == (Bigint *)0x0) {
          return (Bigint *)0x0;
        }
        _nd_local = _nd_local + 1;
      }
      for (; _nd_local = _nd_local + 1, x < nd; x = x + 1) {
        _k = multadd(_k,10,*_nd_local + -0x30);
        if (_k == (Bigint *)0x0) {
          return (Bigint *)0x0;
        }
      }
      s_local = (char *)_k;
    }
  }
  return (Bigint *)s_local;
}

Assistant:

static Bigint *
s2b(const char *s, int nd0, int nd, ULong y9)
{
    Bigint *b;
    int i, k;
    Long x, y;

    x = (nd + 8) / 9;
    for(k = 0, y = 1; x > y; y <<= 1, k++) ;
    b = Balloc(k);
    if (b == NULL)
        return NULL;
    b->x[0] = y9;
    b->wds = 1;

    if (nd <= 9)
      return b;

    s += 9;
    for (i = 9; i < nd0; i++) {
        b = multadd(b, 10, *s++ - '0');
        if (b == NULL)
            return NULL;
    }
    s++;
    for(; i < nd; i++) {
        b = multadd(b, 10, *s++ - '0');
        if (b == NULL)
            return NULL;
    }
    return b;
}